

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_emit(jit_State *J)

{
  byte bVar1;
  uint uVar2;
  IRIns *pIVar3;
  IROp op;
  IRIns *ir;
  IRRef ref;
  jit_State *J_local;
  IRRef ref_1;
  
  uVar2 = (J->cur).nins;
  if (J->irtoplim <= uVar2) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar2 + 1;
  pIVar3 = (J->cur).ir + uVar2;
  bVar1 = (J->fold).ins.field_1.o;
  (pIVar3->field_0).prev = J->chain[(uint)bVar1];
  J->chain[(uint)bVar1] = (IRRef1)uVar2;
  (pIVar3->field_1).o = bVar1;
  (pIVar3->field_0).op1 = (J->fold).ins.field_0.op1;
  (pIVar3->field_0).op2 = (J->fold).ins.field_0.op2;
  (J->guardemit).irt = (J->guardemit).irt | (J->fold).ins.field_1.t.irt;
  (pIVar3->field_1).t.irt = (J->fold).ins.field_1.t.irt;
  return uVar2 + (uint)(pIVar3->field_1).t.irt * 0x1000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_emit(jit_State *J)
{
  IRRef ref = lj_ir_nextins(J);
  IRIns *ir = IR(ref);
  IROp op = fins->o;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
  ir->o = op;
  ir->op1 = fins->op1;
  ir->op2 = fins->op2;
  J->guardemit.irt |= fins->t.irt;
  return TREF(ref, irt_t((ir->t = fins->t)));
}